

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum-dtoa.cc
# Opt level: O3

void __thiscall
double_conversion::BignumDtoa
          (double_conversion *this,double v,BignumDtoaMode mode,int requested_digits,
          Vector<char> buffer,int *length,int *decimal_point)

{
  long lVar1;
  double dVar2;
  uint16_t uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  BignumDtoaMode BVar8;
  byte *pbVar9;
  byte bVar10;
  uint uVar11;
  undefined4 in_register_00000014;
  char *pcVar12;
  ulong uVar13;
  ulong factor;
  uint uVar14;
  Bignum *pBVar15;
  int *piVar16;
  uint uVar17;
  long in_FS_OFFSET;
  bool bVar18;
  bool bVar19;
  float fVar20;
  Vector<char> buffer_00;
  undefined4 in_stack_fffffffffffff788;
  Bignum local_848;
  Bignum local_644;
  Bignum local_440;
  Bignum local_23c;
  long local_38;
  
  pcVar12 = (char *)CONCAT44(in_register_00000014,requested_digits);
  piVar16 = buffer._8_8_;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  uVar14 = (uint)this;
  if (uVar14 == 1) {
    fVar20 = (float)v;
    uVar11 = (uint)fVar20 & 0x7fffff;
    bVar18 = ((uint)fVar20 & 0x7f800000) == 0;
    uVar17 = uVar11 + 0x800000;
    if (bVar18) {
      uVar17 = uVar11;
    }
    factor = (ulong)uVar17;
    iVar5 = -0x95;
    if (!bVar18) {
      iVar5 = ((uint)fVar20 >> 0x17 & 0xff) - 0x96;
    }
    bVar18 = uVar11 == 0;
    bVar19 = ((uint)fVar20 & 0x7f000000) == 0;
  }
  else {
    uVar13 = (ulong)v & 0xfffffffffffff;
    bVar18 = ((ulong)v & 0x7ff0000000000000) == 0;
    factor = uVar13 + 0x10000000000000;
    if (bVar18) {
      factor = uVar13;
    }
    iVar5 = -0x432;
    if (!bVar18) {
      iVar5 = ((uint)((ulong)v >> 0x34) & 0x7ff) - 0x433;
    }
    bVar18 = uVar13 == 0;
    bVar19 = ((ulong)v & 0x7fe0000000000000) == 0;
  }
  lVar1 = 0x3f;
  if ((factor & 0xfffffffffffff) != 0) {
    for (; (factor & 0xfffffffffffff) >> lVar1 == 0; lVar1 = lVar1 + -1) {
    }
  }
  iVar4 = (iVar5 + 0xb) - ((uint)lVar1 ^ 0x3f);
  if ((factor & 0x10000000000000) != 0) {
    iVar4 = iVar5;
  }
  dVar2 = ceil((double)(iVar4 + 0x34) * 0.30102999566398114 + -1e-10);
  uVar17 = (uint)dVar2;
  if ((uVar14 == 2) && ((int)mode < (int)~uVar17)) {
    *pcVar12 = '\0';
    *piVar16 = 0;
    *length = -mode;
    goto LAB_003dc9a8;
  }
  memset(local_23c.bigits_buffer_,0xaa,0x200);
  local_23c.used_bigits_ = 0;
  local_23c.exponent_ = 0;
  memset(local_440.bigits_buffer_,0xaa,0x200);
  local_440.used_bigits_ = 0;
  local_440.exponent_ = 0;
  memset(local_644.bigits_buffer_,0xaa,0x200);
  local_644.used_bigits_ = 0;
  local_644.exponent_ = 0;
  memset(local_848.bigits_buffer_,0xaa,0x200);
  local_848.used_bigits_ = 0;
  local_848.exponent_ = 0;
  if (iVar5 < 0) {
    if ((int)uVar17 < 0) {
      Bignum::AssignPowerUInt16(&local_23c,10,-uVar17);
      if (uVar14 < 2) {
        Bignum::AssignBignum(&local_848,&local_23c);
        Bignum::AssignBignum(&local_644,&local_23c);
        Bignum::MultiplyByUInt64(&local_23c,factor);
        Bignum::AssignUInt16(&local_440,1);
        Bignum::ShiftLeft(&local_440,-iVar5);
        Bignum::ShiftLeft(&local_23c,1);
        iVar5 = 1;
      }
      else {
        Bignum::MultiplyByUInt64(&local_23c,factor);
        Bignum::AssignUInt16(&local_440,1);
        iVar5 = -iVar5;
      }
      pBVar15 = &local_440;
      goto LAB_003dc6cb;
    }
    Bignum::AssignUInt64(&local_23c,factor);
    Bignum::AssignPowerUInt16(&local_440,10,uVar17);
    Bignum::ShiftLeft(&local_440,-iVar5);
    if (1 < uVar14) goto LAB_003dc714;
    Bignum::ShiftLeft(&local_440,1);
    Bignum::ShiftLeft(&local_23c,1);
    Bignum::AssignUInt16(&local_848,1);
    Bignum::AssignUInt16(&local_644,1);
LAB_003dc6d0:
    if (!(bool)(!bVar19 & bVar18 ^ 1U | 1 < uVar14)) {
      Bignum::ShiftLeft(&local_440,1);
      Bignum::ShiftLeft(&local_23c,1);
      Bignum::ShiftLeft(&local_848,1);
    }
  }
  else {
    Bignum::AssignUInt64(&local_23c,factor);
    Bignum::ShiftLeft(&local_23c,iVar5);
    Bignum::AssignPowerUInt16(&local_440,10,uVar17);
    if (uVar14 < 2) {
      Bignum::ShiftLeft(&local_440,1);
      Bignum::ShiftLeft(&local_23c,1);
      Bignum::AssignUInt16(&local_848,1);
      Bignum::ShiftLeft(&local_848,iVar5);
      pBVar15 = &local_644;
      Bignum::AssignUInt16(pBVar15,1);
LAB_003dc6cb:
      Bignum::ShiftLeft(pBVar15,iVar5);
      goto LAB_003dc6d0;
    }
  }
LAB_003dc714:
  iVar5 = Bignum::PlusCompare(&local_23c,&local_848,&local_440);
  if ((factor & 1) == 0) {
    if (-1 < iVar5) goto LAB_003dc793;
LAB_003dc73c:
    *length = uVar17;
    Bignum::MultiplyByUInt32(&local_23c,10);
    iVar5 = Bignum::Compare(&local_644,&local_848);
    Bignum::MultiplyByUInt32(&local_644,10);
    if (iVar5 == 0) {
      Bignum::AssignBignum(&local_848,&local_644);
    }
    else {
      Bignum::MultiplyByUInt32(&local_848,10);
    }
  }
  else {
    if (iVar5 < 1) goto LAB_003dc73c;
LAB_003dc793:
    *length = uVar17 + 1;
  }
  if (uVar14 < 2) {
    iVar5 = Bignum::Compare(&local_644,&local_848);
    pBVar15 = &local_848;
    if (iVar5 == 0) {
      pBVar15 = &local_644;
    }
    *piVar16 = 0;
    uVar17 = (uint)factor & 1 ^ 1;
    uVar14 = (uint)((factor & 1) == 0);
    iVar4 = -uVar14;
    while( true ) {
      uVar3 = Bignum::DivideModuloIntBignum(&local_23c,&local_440);
      iVar6 = *piVar16;
      *piVar16 = iVar6 + 1;
      pcVar12[iVar6] = (char)uVar3 + '0';
      iVar6 = Bignum::Compare(&local_23c,&local_644);
      iVar7 = Bignum::PlusCompare(&local_23c,pBVar15,&local_440);
      if ((iVar6 < (int)uVar17) ||
         (iVar7 != iVar4 && SBORROW4(iVar7,iVar4) == (int)(iVar7 + uVar14) < 0)) break;
      Bignum::MultiplyByUInt32(&local_23c,10);
      Bignum::MultiplyByUInt32(&local_644,10);
      if (iVar5 != 0) {
        Bignum::MultiplyByUInt32(&local_848,10);
      }
    }
    if ((iVar6 < (int)uVar17) &&
       (iVar7 != iVar4 && SBORROW4(iVar7,iVar4) == (int)(iVar7 + uVar14) < 0)) {
      iVar5 = Bignum::PlusCompare(&local_23c,&local_23c,&local_440);
      if (-1 < iVar5) {
        pbVar9 = (byte *)(pcVar12 + (long)*piVar16 + -1);
        bVar10 = *pbVar9;
        if ((iVar5 != 0) || ((bVar10 & 1) != 0)) goto LAB_003dc917;
      }
    }
    else if ((int)uVar17 <= iVar6) {
      pbVar9 = (byte *)(pcVar12 + (long)*piVar16 + -1);
      bVar10 = *pbVar9;
LAB_003dc917:
      *pbVar9 = bVar10 + 1;
    }
  }
  else if (uVar14 == 2) {
    BVar8 = -*length;
    if ((int)mode < (int)BVar8) {
      *length = -mode;
    }
    else {
      if (BVar8 != mode) {
        mode = *length + mode;
        goto LAB_003dc7c6;
      }
      Bignum::MultiplyByUInt32(&local_440,10);
      iVar5 = Bignum::PlusCompare(&local_23c,&local_23c,&local_440);
      if (-1 < iVar5) {
        *pcVar12 = '1';
        *piVar16 = 1;
        *length = *length + 1;
        goto LAB_003dc997;
      }
    }
    *piVar16 = 0;
  }
  else {
    if (uVar14 != 3) {
      abort();
    }
LAB_003dc7c6:
    buffer_00._8_8_ = piVar16;
    buffer_00.start_ = pcVar12;
    GenerateCountedDigits
              (mode,length,&local_23c,&local_440,buffer_00,
               (int *)CONCAT44(uVar14,in_stack_fffffffffffff788));
  }
LAB_003dc997:
  pcVar12[*piVar16] = '\0';
LAB_003dc9a8:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void BignumDtoa(double v, BignumDtoaMode mode, int requested_digits,
                Vector<char> buffer, int* length, int* decimal_point) {
  DOUBLE_CONVERSION_ASSERT(v > 0);
  DOUBLE_CONVERSION_ASSERT(!Double(v).IsSpecial());
  uint64_t significand;
  int exponent;
  bool lower_boundary_is_closer;
  if (mode == BIGNUM_DTOA_SHORTEST_SINGLE) {
    float f = static_cast<float>(v);
    DOUBLE_CONVERSION_ASSERT(f == v);
    significand = Single(f).Significand();
    exponent = Single(f).Exponent();
    lower_boundary_is_closer = Single(f).LowerBoundaryIsCloser();
  } else {
    significand = Double(v).Significand();
    exponent = Double(v).Exponent();
    lower_boundary_is_closer = Double(v).LowerBoundaryIsCloser();
  }
  bool need_boundary_deltas =
      (mode == BIGNUM_DTOA_SHORTEST || mode == BIGNUM_DTOA_SHORTEST_SINGLE);

  bool is_even = (significand & 1) == 0;
  int normalized_exponent = NormalizedExponent(significand, exponent);
  // estimated_power might be too low by 1.
  int estimated_power = EstimatePower(normalized_exponent);

  // Shortcut for Fixed.
  // The requested digits correspond to the digits after the point. If the
  // number is much too small, then there is no need in trying to get any
  // digits.
  if (mode == BIGNUM_DTOA_FIXED && -estimated_power - 1 > requested_digits) {
    buffer[0] = '\0';
    *length = 0;
    // Set decimal-point to -requested_digits. This is what Gay does.
    // Note that it should not have any effect anyways since the string is
    // empty.
    *decimal_point = -requested_digits;
    return;
  }

  Bignum numerator;
  Bignum denominator;
  Bignum delta_minus;
  Bignum delta_plus;
  // Make sure the bignum can grow large enough. The smallest double equals
  // 4e-324. In this case the denominator needs fewer than 324*4 binary digits.
  // The maximum double is 1.7976931348623157e308 which needs fewer than
  // 308*4 binary digits.
  DOUBLE_CONVERSION_ASSERT(Bignum::kMaxSignificantBits >= 324*4);
  InitialScaledStartValues(significand, exponent, lower_boundary_is_closer,
                           estimated_power, need_boundary_deltas,
                           &numerator, &denominator,
                           &delta_minus, &delta_plus);
  // We now have v = (numerator / denominator) * 10^estimated_power.
  FixupMultiply10(estimated_power, is_even, decimal_point,
                  &numerator, &denominator,
                  &delta_minus, &delta_plus);
  // We now have v = (numerator / denominator) * 10^(decimal_point-1), and
  //  1 <= (numerator + delta_plus) / denominator < 10
  switch (mode) {
    case BIGNUM_DTOA_SHORTEST:
    case BIGNUM_DTOA_SHORTEST_SINGLE:
      GenerateShortestDigits(&numerator, &denominator,
                             &delta_minus, &delta_plus,
                             is_even, buffer, length);
      break;
    case BIGNUM_DTOA_FIXED:
      BignumToFixed(requested_digits, decimal_point,
                    &numerator, &denominator,
                    buffer, length);
      break;
    case BIGNUM_DTOA_PRECISION:
      GenerateCountedDigits(requested_digits, decimal_point,
                            &numerator, &denominator,
                            buffer, length);
      break;
    default:
      DOUBLE_CONVERSION_UNREACHABLE();
  }
  buffer[*length] = '\0';
}